

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Helper.h
# Opt level: O1

HRESULT utf8::WideStringToNarrow<void*(*)(unsigned_long)>
                  (_func_void_ptr_unsigned_long *allocator,LPCWSTR sourceString,size_t sourceCount,
                  LPSTR *destStringPtr,size_t *destCount,size_t *allocateCount)

{
  code *pcVar1;
  bool bVar2;
  utf8char_t *dest;
  size_t sVar3;
  undefined4 *puVar4;
  ulong cbDest;
  HRESULT HVar5;
  
  HVar5 = -0x7ff8fff2;
  if ((sourceCount < 0xffffffff) && (cbDest = sourceCount * 3 + 1, sourceCount <= cbDest)) {
    dest = (utf8char_t *)(*allocator)(cbDest);
    if (dest != (utf8char_t *)0x0) {
      sVar3 = EncodeIntoAndNullTerminate<(utf8::Utf8EncodingKind)1>
                        (dest,cbDest,sourceString,(charcount_t)sourceCount);
      if (cbDest < sVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Codex/Utf8Helper.h"
                           ,0x33,"(cbEncoded <= cbDestString)","cbEncoded <= cbDestString");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      *destStringPtr = (LPSTR)dest;
      *destCount = sVar3;
      HVar5 = 0;
      if (allocateCount != (size_t *)0x0) {
        *allocateCount = sVar3;
        HVar5 = 0;
      }
    }
  }
  return HVar5;
}

Assistant:

HRESULT WideStringToNarrow(
        _In_ AllocatorFunction allocator,
        _In_ LPCWSTR sourceString,
        size_t sourceCount,
        _Out_ LPSTR* destStringPtr,
        _Out_ size_t* destCount,
        size_t* allocateCount = nullptr)
    {
        size_t cchSourceString = sourceCount;

        if (cchSourceString >= MAXUINT32)
        {
            return E_OUTOFMEMORY;
        }

        // Multiply by 3 for max size of encoded character, plus 1 for the null terminator (don't need 3 bytes for the null terminator)
        size_t cbDestString = (cchSourceString * 3) + 1;

        // Check for overflow- cbDestString should be >= cchSourceString
        if (cbDestString < cchSourceString)
        {
            return E_OUTOFMEMORY;
        }

        utf8char_t* destString = (utf8char_t*)allocator(cbDestString);
        if (destString == nullptr)
        {
            return E_OUTOFMEMORY;
        }

        size_t cbEncoded = utf8::EncodeIntoAndNullTerminate<utf8::Utf8EncodingKind::TrueUtf8>(destString, cbDestString, sourceString, static_cast<charcount_t>(cchSourceString));
        Assert(cbEncoded <= cbDestString);
        static_assert(sizeof(utf8char_t) == sizeof(char), "Needs to be valid for cast");
        *destStringPtr = (char*)destString;
        *destCount = cbEncoded;
        if (allocateCount != nullptr)
        {
            *allocateCount = cbEncoded;
        }

        return S_OK;
    }